

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionModelMapping.cpp
# Opt level: O1

void __thiscall TransitionModelMapping::~TransitionModelMapping(TransitionModelMapping *this)

{
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *pmVar1;
  size_type sVar2;
  pointer ppmVar3;
  pointer ppmVar4;
  
  (this->super_TransitionModelDiscrete).super_TransitionModelDiscreteInterface.super_TransitionModel
  ._vptr_TransitionModel = (_func_int **)&PTR__TransitionModelMapping_005d0138;
  ppmVar3 = (this->_m_T).
            super__Vector_base<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppmVar4 = (this->_m_T).
                 super__Vector_base<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppmVar4 != ppmVar3;
      ppmVar4 = ppmVar4 + 1) {
    pmVar1 = *ppmVar4;
    if (pmVar1 != (matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                   *)0x0) {
      sVar2 = (pmVar1->data_).size_;
      if (sVar2 != 0) {
        operator_delete((pmVar1->data_).data_,sVar2 << 3);
      }
      operator_delete(pmVar1,0x28);
    }
    ppmVar3 = (this->_m_T).
              super__Vector_base<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  ppmVar4 = (this->_m_T).
            super__Vector_base<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppmVar3 != ppmVar4) {
    (this->_m_T).
    super__Vector_base<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppmVar4;
  }
  if (ppmVar4 != (pointer)0x0) {
    operator_delete(ppmVar4,(long)(this->_m_T).
                                  super__Vector_base<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*,_std::allocator<boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppmVar4
                   );
  }
  TransitionModelDiscrete::~TransitionModelDiscrete(&this->super_TransitionModelDiscrete);
  return;
}

Assistant:

TransitionModelMapping::~TransitionModelMapping()
{    
    for(vector<Matrix*>::iterator it=_m_T.begin();
        it!=_m_T.end(); ++it)
        delete(*it);
    _m_T.clear();
}